

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::RangeStaticLayerParams::SerializeWithCachedSizes
          (RangeStaticLayerParams *this,CodedOutputStream *output)

{
  float fVar1;
  
  fVar1 = this->endvalue_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    google::protobuf::internal::WireFormatLite::WriteFloat(1,fVar1,output);
  }
  fVar1 = this->startvalue_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    google::protobuf::internal::WireFormatLite::WriteFloat(2,fVar1,output);
  }
  fVar1 = this->stepsizevalue_;
  if ((fVar1 == 0.0) && (!NAN(fVar1))) {
    return;
  }
  google::protobuf::internal::WireFormatLite::WriteFloat(3,fVar1,output);
  return;
}

Assistant:

void RangeStaticLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.RangeStaticLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // float endValue = 1;
  if (this->endvalue() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(1, this->endvalue(), output);
  }

  // float startValue = 2;
  if (this->startvalue() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(2, this->startvalue(), output);
  }

  // float stepSizeValue = 3;
  if (this->stepsizevalue() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(3, this->stepsizevalue(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.RangeStaticLayerParams)
}